

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dual_Resampler.cpp
# Opt level: O0

void __thiscall Dual_Resampler::resize(Dual_Resampler *this,int pairs)

{
  size_t sVar1;
  uint uVar2;
  int in_ESI;
  long in_RDI;
  double dVar3;
  int new_sample_buf_size;
  
  uVar2 = in_ESI << 1;
  if ((*(uint *)(in_RDI + 0x18) != uVar2) &&
     (sVar1 = blargg_vector<short>::size((blargg_vector<short> *)(in_RDI + 8)), uVar2 <= sVar1)) {
    *(uint *)(in_RDI + 0x18) = uVar2;
    dVar3 = Fir_Resampler_::ratio((Fir_Resampler_ *)(in_RDI + 0x28));
    *(int *)(in_RDI + 0x1c) = (int)((double)in_ESI * dVar3) * 2 + 2;
    clear((Dual_Resampler *)0x80fd22);
  }
  return;
}

Assistant:

void Dual_Resampler::resize( int pairs )
{
	int new_sample_buf_size = pairs * 2;
	if ( sample_buf_size != new_sample_buf_size )
	{
		if ( (unsigned) new_sample_buf_size > sample_buf.size() )
		{
			check( false );
			return;
		}
		sample_buf_size = new_sample_buf_size;
		oversamples_per_frame = int (pairs * resampler.ratio()) * 2 + 2;
		clear();
	}
}